

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintBool_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,bool val)

{
  undefined7 in_register_00000011;
  char *pcVar1;
  allocator local_9;
  
  pcVar1 = "false";
  if ((int)CONCAT71(in_register_00000011,val) != 0) {
    pcVar1 = "true";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

string TextFormat::FieldValuePrinter::PrintBool(bool val) const {
  return val ? "true" : "false";
}